

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O1

bool __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,weighted_vec_array *weighted_vecs,
          uint max_clusters,vector<crnlib::vector<unsigned_int>_> *cluster_indices,
          progress_callback_func pProgress_callback,void *pProgress_callback_data)

{
  vector_clusterizer *this_00;
  bool bVar1;
  uint uVar2;
  task_pool *this_01;
  vector<unsigned_int> *pvVar3;
  void *pvVar4;
  long lVar5;
  uint *puVar6;
  crn_thread_id_t cVar7;
  ulong uVar8;
  long lVar9;
  executable_task *pObj;
  uint min_new_capacity;
  uint i;
  uint64 data;
  long lVar10;
  uint uVar11;
  undefined8 *puVar12;
  undefined8 *pData_ptr;
  uint i_1;
  uint uVar13;
  vector<unsigned_int> primary_indices;
  vector<unsigned_int> indices [6];
  create_clusters_task_state task_state [4];
  vector<unsigned_int> local_148;
  vector<unsigned_int> local_138;
  vector<unsigned_int> local_128;
  vector<unsigned_int> local_118;
  vector<unsigned_int> local_108;
  vector<unsigned_int> local_f8;
  vector<unsigned_int> local_e8;
  undefined8 local_d8;
  int local_d0 [2];
  long lStack_c8;
  uint local_c0 [34];
  undefined8 local_38;
  
  cVar7 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar7;
  this->m_canceled = false;
  this->m_pProgress_callback = pProgress_callback;
  this->m_pProgress_callback_data = pProgress_callback_data;
  if (max_clusters < 0x80) {
    this_00 = this->m_clusterizers;
    clusterizer<crnlib::vec<16U,_float>_>::clear(this_00);
    vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::reserve
              (&this_00->m_training_vecs,weighted_vecs->m_size);
    if (weighted_vecs->m_size != 0) {
      lVar9 = 0;
      uVar8 = 0;
      do {
        clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                  (this_00,(vec<16U,_float> *)((long)(weighted_vecs->m_p->m_vec).m_s + lVar9),
                   *(uint *)((long)(&weighted_vecs->m_p->m_vec + 1) + lVar9));
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x44;
      } while (uVar8 < weighted_vecs->m_size);
    }
    clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
              (this_00,max_clusters,generate_codebook_progress_callback,this,false);
    clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
              (this_00,this->m_clusterizers[0].m_codebook.m_size,cluster_indices);
  }
  else {
    uVar2 = weighted_vecs->m_size;
    local_148.m_p = (uint *)0x0;
    local_148.m_size = 0;
    local_148.m_capacity = 0;
    if (uVar2 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,uVar2,uVar2 == 1,4,(object_mover)0x0,false);
      memset(local_148.m_p + local_148.m_size,0,(ulong)(uVar2 - local_148.m_size) << 2);
      local_148.m_size = uVar2;
    }
    if (weighted_vecs->m_size != 0) {
      uVar8 = 0;
      do {
        local_148.m_p[uVar8] = (uint)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar8 < weighted_vecs->m_size);
    }
    local_e8.m_p = (uint *)0x0;
    local_e8.m_size = 0;
    local_e8.m_capacity = 0;
    local_f8.m_p = (uint *)0x0;
    local_f8.m_size = 0;
    local_f8.m_capacity = 0;
    local_108.m_p = (uint *)0x0;
    local_108.m_size = 0;
    local_108.m_capacity = 0;
    local_118.m_p = (uint *)0x0;
    local_118.m_size = 0;
    local_118.m_capacity = 0;
    local_128.m_p = (uint *)0x0;
    local_128.m_size = 0;
    local_128.m_capacity = 0;
    local_138.m_p = (uint *)0x0;
    local_138.m_size = 0;
    local_138.m_capacity = 0;
    compute_split(this,weighted_vecs,&local_148,&local_138,&local_128);
    compute_split(this,weighted_vecs,&local_138,&local_118,&local_108);
    compute_split(this,weighted_vecs,&local_128,&local_f8,&local_e8);
    lVar9 = 0;
    do {
      *(undefined1 (*) [16])((long)&lStack_c8 + lVar9) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&local_d8 + lVar9) = (undefined1  [16])0x0;
      *(undefined4 *)((long)local_c0 + lVar9 + 8) = 0;
      lVar9 = lVar9 + 0x28;
    } while (lVar9 != 0xa0);
    this->m_cluster_task_displayed_progress = false;
    uVar13 = 0;
    lVar9 = 0x28;
    do {
      uVar13 = (uVar13 + 1) - (uint)(*(int *)((long)&local_138.m_p + lVar9) == 0);
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x68);
    puVar12 = &local_38;
    pData_ptr = &local_d8;
    lVar9 = -0x40;
    data = 0;
    do {
      if (*(int *)((long)local_d0 + lVar9) != 0) {
        *pData_ptr = weighted_vecs;
        pData_ptr[1] = (long)&local_d8 + lVar9;
        *(uint *)(pData_ptr + 4) = ((uVar13 >> 1) + max_clusters) / uVar13;
        this_01 = this->m_pTask_pool;
        pObj = (executable_task *)crnlib_malloc(0x28);
        pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001de5e0;
        pObj[1]._vptr_executable_task = (_func_int **)this;
        pObj[2]._vptr_executable_task = (_func_int **)create_clusters_task;
        pObj[3]._vptr_executable_task = (_func_int **)0x0;
        *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
        task_pool::queue_task(this_01,pObj,data,pData_ptr);
      }
      data = data + 1;
      pData_ptr = pData_ptr + 5;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0);
    task_pool::join(this->m_pTask_pool);
    bVar1 = this->m_canceled;
    if (bVar1 != true) {
      vector<crnlib::vector<unsigned_int>_>::reserve
                (cluster_indices,local_c0[0x1e] + local_c0[10] + local_c0[0x14] + local_c0[0]);
      uVar13 = cluster_indices->m_size;
      if ((ulong)uVar13 != 0) {
        pvVar3 = cluster_indices->m_p;
        lVar9 = 0;
        do {
          pvVar4 = *(void **)((long)&pvVar3->m_p + lVar9);
          if (pvVar4 != (void *)0x0) {
            crnlib_free(pvVar4);
          }
          lVar9 = lVar9 + 0x10;
        } while ((ulong)uVar13 << 4 != lVar9);
        cluster_indices->m_size = 0;
      }
      lVar9 = 0;
      do {
        uVar13 = cluster_indices->m_size;
        uVar11 = local_c0[lVar9 * 10];
        if (uVar11 != 0) {
          min_new_capacity = uVar11 + uVar13;
          if (min_new_capacity < uVar13) {
            pvVar3 = cluster_indices->m_p;
            lVar10 = 0;
            do {
              pvVar4 = *(void **)((long)&pvVar3[min_new_capacity].m_p + lVar10);
              if (pvVar4 != (void *)0x0) {
                crnlib_free(pvVar4);
              }
              lVar10 = lVar10 + 0x10;
            } while ((ulong)-uVar11 << 4 != lVar10);
          }
          else {
            if (cluster_indices->m_capacity < min_new_capacity) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)cluster_indices,min_new_capacity,uVar11 == 1,0x10,
                         (object_mover)0x0,false);
            }
            uVar11 = cluster_indices->m_size;
            if (min_new_capacity != uVar11) {
              memset(cluster_indices->m_p + uVar11,0,(ulong)(min_new_capacity - uVar11) << 4);
            }
          }
          cluster_indices->m_size = min_new_capacity;
        }
        if (local_c0[lVar9 * 10] != 0) {
          lVar10 = 0xc;
          uVar8 = 0;
          do {
            uVar11 = (int)uVar8 + uVar13;
            pvVar3 = cluster_indices->m_p;
            lVar5 = (&lStack_c8)[lVar9 * 5];
            puVar6 = pvVar3[uVar11].m_p;
            pvVar3[uVar11].m_p = *(uint **)(lVar5 + -0xc + lVar10);
            *(uint **)(lVar5 + -0xc + lVar10) = puVar6;
            uVar2 = pvVar3[uVar11].m_size;
            pvVar3[uVar11].m_size = *(uint *)(lVar5 + -4 + lVar10);
            *(uint *)(lVar5 + -4 + lVar10) = uVar2;
            uVar2 = pvVar3[uVar11].m_capacity;
            pvVar3[uVar11].m_capacity = *(uint *)(lVar5 + lVar10);
            *(uint *)(lVar5 + lVar10) = uVar2;
            uVar8 = uVar8 + 1;
            lVar10 = lVar10 + 0x10;
          } while (uVar8 < local_c0[lVar9 * 10]);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    do {
      lVar9 = puVar12[-3];
      if (lVar9 != 0) {
        uVar13 = *(uint *)(puVar12 + -2);
        if ((ulong)uVar13 != 0) {
          lVar10 = 0;
          do {
            pvVar4 = *(void **)(lVar9 + lVar10);
            if (pvVar4 != (void *)0x0) {
              crnlib_free(pvVar4);
            }
            lVar10 = lVar10 + 0x10;
          } while ((ulong)uVar13 << 4 != lVar10);
        }
        crnlib_free((void *)puVar12[-3]);
      }
      puVar12 = puVar12 + -5;
    } while (puVar12 != &local_d8);
    lVar9 = 0x60;
    do {
      pvVar4 = *(void **)((long)&local_148.m_p + lVar9);
      if (pvVar4 != (void *)0x0) {
        crnlib_free(pvVar4);
      }
      lVar9 = lVar9 + -0x10;
    } while (lVar9 != 0);
    if (local_148.m_p != (uint *)0x0) {
      crnlib_free(local_148.m_p);
    }
    if (bVar1 != false) {
      return false;
    }
  }
  return (bool)(this->m_canceled ^ 1);
}

Assistant:

bool create_clusters(
      const weighted_vec_array& weighted_vecs,
      uint max_clusters, crnlib::vector<crnlib::vector<uint> >& cluster_indices,
      progress_callback_func pProgress_callback,
      void* pProgress_callback_data) {
    m_main_thread_id = crn_get_current_thread_id();
    m_canceled = false;
    m_pProgress_callback = pProgress_callback;
    m_pProgress_callback_data = pProgress_callback_data;

    if (max_clusters >= 128) {
      crnlib::vector<uint> primary_indices(weighted_vecs.size());
      for (uint i = 0; i < weighted_vecs.size(); i++)
        primary_indices[i] = i;

      CRNLIB_ASSUME(cMaxClusterizers == 4);

      crnlib::vector<uint> indices[6];

      compute_split(weighted_vecs, primary_indices, indices[0], indices[1]);
      compute_split(weighted_vecs, indices[0], indices[2], indices[3]);
      compute_split(weighted_vecs, indices[1], indices[4], indices[5]);

      create_clusters_task_state task_state[4];

      m_cluster_task_displayed_progress = false;

      uint total_partitions = 0;
      for (uint i = 0; i < 4; i++) {
        const uint num_indices = indices[2 + i].size();
        if (num_indices)
          total_partitions++;
      }

      for (uint i = 0; i < 4; i++) {
        const uint num_indices = indices[2 + i].size();
        if (!num_indices)
          continue;

        task_state[i].m_pWeighted_vecs = &weighted_vecs;
        task_state[i].m_pIndices = &indices[2 + i];
        task_state[i].m_max_clusters = (max_clusters + (total_partitions / 2)) / total_partitions;

        m_pTask_pool->queue_object_task(this, &threaded_clusterizer::create_clusters_task, i, &task_state[i]);
      }

      m_pTask_pool->join();

      if (m_canceled)
        return false;

      uint total_clusters = 0;
      for (uint i = 0; i < 4; i++)
        total_clusters += task_state[i].m_cluster_indices.size();

      cluster_indices.reserve(total_clusters);
      cluster_indices.resize(0);

      for (uint i = 0; i < 4; i++) {
        const uint ofs = cluster_indices.size();

        cluster_indices.resize(ofs + task_state[i].m_cluster_indices.size());

        for (uint j = 0; j < task_state[i].m_cluster_indices.size(); j++) {
          cluster_indices[ofs + j].swap(task_state[i].m_cluster_indices[j]);
        }
      }
    } else {
      m_clusterizers[0].clear();
      m_clusterizers[0].get_training_vecs().reserve(weighted_vecs.size());

      for (uint i = 0; i < weighted_vecs.size(); i++) {
        const weighted_vec& v = weighted_vecs[i];

        m_clusterizers[0].add_training_vec(v.m_vec, v.m_weight);
      }

      m_clusterizers[0].generate_codebook(max_clusters, generate_codebook_progress_callback, this, false);  //m_params.m_dxt_quality <= cCRNDXTQualityFast);

      const uint num_clusters = m_clusterizers[0].get_codebook_size();

      m_clusterizers[0].retrieve_clusters(num_clusters, cluster_indices);
    }

    return !m_canceled;
  }